

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O0

void thread3(void)

{
  int iVar1;
  _Bool _Var2;
  char local_58 [8];
  char str [64];
  int local_10;
  int rounds;
  int tok;
  
  put_str("[Thread 3] started");
  local_10 = 10;
  while( true ) {
    iVar1 = local_10;
    _Var2 = shutting_down();
    if (!_Var2) {
      local_10 = local_10 + -1;
    }
    if (_Var2 || iVar1 < 1) break;
    snprintf(local_58,0x40,"[Thread 3] running: %d");
    put_str(local_58);
    yield();
  }
  put_str("[Thread 3] exiting");
  return;
}

Assistant:

static void
thread3(void)
{
    put_str("[Thread 3] started");
    int tok = 0;
    int rounds = 10;
    while (!shutting_down() && rounds-- > 0) {
        char str[64];
        snprintf(str, sizeof str, "[Thread 3] running: %d", tok++);
        put_str(str);
        yield();
    }

    put_str("[Thread 3] exiting");
}